

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::CanProveConditionalBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,
          bool *result)

{
  OpCode OVar1;
  Var pvVar2;
  bool bVar3;
  ObjectType OVar4;
  BOOL BVar5;
  int iVar6;
  ValueInfo *pVVar7;
  ScriptContext *pSVar8;
  ValueInfo *pVVar9;
  ScriptContextInfo *pSVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double value_00;
  byte local_141;
  ValueInfo *src1ValueInfo_1;
  double value;
  ValueInfo *src1ValueInfo;
  ValueInfo *src2ValInfo_1;
  ValueInfo *src1ValInfo_1;
  ValueInfo *src2ValInfo;
  ValueInfo *src1ValInfo;
  uint local_60;
  int32 constVal;
  int32 right;
  int32 left;
  int64 right64;
  int64 left64;
  Var pvStack_40;
  anon_class_1_0_00000001 AreSourcesEqual;
  Var src2Var_local;
  Var src1Var_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  OVar1 = instr->m_opcode;
  pvStack_40 = src2Var;
  if (OVar1 == BrEq_A) {
LAB_0059e12d:
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = constVal == local_60;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,true),
       bVar3)) {
      *result = true;
      return true;
    }
    if ((src1Var != (Var)0x0) && (pvStack_40 != (Var)0x0)) {
      bVar3 = anon_unknown.dwarf_9e9497::Op_JitEq
                        (result,src1Val,src2Val,src1Var,pvStack_40,this->func,false);
      if (bVar3) {
        return true;
      }
      return false;
    }
    bVar3 = anon_unknown.dwarf_9e9497::BoolAndIntStaticAndTypeMismatch
                      (src1Val,src2Val,src1Var,pvStack_40);
    if (bVar3) {
      *result = false;
      return true;
    }
    return false;
  }
  if (OVar1 == BrNeq_A) {
LAB_0059e244:
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = constVal != local_60;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,true),
       bVar3)) {
      *result = false;
      return true;
    }
    if ((src1Var != (Var)0x0) && (pvStack_40 != (Var)0x0)) {
      bVar3 = anon_unknown.dwarf_9e9497::Op_JitNeq
                        (result,src1Val,src2Val,src1Var,pvStack_40,this->func,false);
      if (bVar3) {
        return true;
      }
      return false;
    }
    bVar3 = anon_unknown.dwarf_9e9497::BoolAndIntStaticAndTypeMismatch
                      (src1Val,src2Val,src1Var,pvStack_40);
    if (bVar3) {
      *result = true;
      return true;
    }
    return false;
  }
  if ((ushort)(OVar1 - BrFalse_A) < 2) {
    pVVar7 = ::Value::GetValueInfo(src1Val);
    bVar3 = ValueType::IsNull(&pVVar7->super_ValueType);
    if ((bVar3) || (bVar3 = ValueType::IsUndefined(&pVVar7->super_ValueType), bVar3)) {
      *result = instr->m_opcode == BrFalse_A;
      return true;
    }
    bVar3 = ValueType::IsObject(&pVVar7->super_ValueType);
    if ((bVar3) && (OVar4 = ValueType::GetObjectType(&pVVar7->super_ValueType), Object < OVar4)) {
      *result = instr->m_opcode == BrTrue_A;
      return true;
    }
    if (src1Var == (Var)0x0) {
      return false;
    }
    pSVar10 = Func::GetScriptContextInfo(this->func);
    iVar6 = (*pSVar10->_vptr_ScriptContextInfo[2])();
    if (src1Var == (Var)CONCAT44(extraout_var,iVar6)) {
      *result = true;
    }
    else {
      pSVar10 = Func::GetScriptContextInfo(this->func);
      iVar6 = (*pSVar10->_vptr_ScriptContextInfo[3])();
      if (src1Var == (Var)CONCAT44(extraout_var_00,iVar6)) {
        *result = false;
      }
      else {
        bVar3 = Js::TaggedInt::Is(src1Var);
        if (bVar3) {
          *result = (undefined1 *)src1Var != &DAT_1000000000000;
        }
        else {
          bVar3 = Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var);
          if (!bVar3) {
            return false;
          }
          value_00 = Js::JavascriptNumber::GetValue(src1Var);
          BVar5 = Js::JavascriptNumber::IsNan(value_00);
          local_141 = 0;
          if (BVar5 == 0) {
            bVar3 = Js::JavascriptNumber::IsZero(value_00);
            local_141 = bVar3 ^ 0xff;
          }
          *result = (bool)(local_141 & 1);
        }
      }
    }
    if (instr->m_opcode != BrFalse_A) {
      return true;
    }
    *result = (bool)((*result ^ 0xffU) & 1);
    return true;
  }
  if (OVar1 == BrGe_A) {
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = (int)local_60 <= constVal;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false),
       bVar3)) {
      *result = true;
      return true;
    }
    if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
      return false;
    }
    bVar3 = Func::IsOOPJIT(this->func);
    pvVar2 = pvStack_40;
    if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
      pSVar8 = Func::GetScriptContext(this->func);
      BVar5 = Js::JavascriptOperators::GreaterEqual(src1Var,pvVar2,pSVar8);
      *result = BVar5 != 0;
      return true;
    }
    return false;
  }
  if (OVar1 == BrGt_A) {
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = (int)local_60 < constVal;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false),
       bVar3)) {
      *result = false;
      return true;
    }
    if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
      return false;
    }
    bVar3 = Func::IsOOPJIT(this->func);
    pvVar2 = pvStack_40;
    if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
      pSVar8 = Func::GetScriptContext(this->func);
      BVar5 = Js::JavascriptOperators::Greater(src1Var,pvVar2,pSVar8);
      *result = BVar5 != 0;
      return true;
    }
    return false;
  }
  if (OVar1 == BrLt_A) {
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = constVal < (int)local_60;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false),
       bVar3)) {
      *result = false;
      return true;
    }
    if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
      return false;
    }
    bVar3 = Func::IsOOPJIT(this->func);
    pvVar2 = pvStack_40;
    if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
      pSVar8 = Func::GetScriptContext(this->func);
      BVar5 = Js::JavascriptOperators::Less(src1Var,pvVar2,pSVar8);
      *result = BVar5 != 0;
      return true;
    }
    return false;
  }
  if (OVar1 == BrLe_A) {
    if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo(src2Val);
        bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
        if (bVar3) {
          *result = constVal <= (int)local_60;
          return true;
        }
      }
    }
    if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
       (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false),
       bVar3)) {
      *result = true;
      return true;
    }
    if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
      return false;
    }
    bVar3 = Func::IsOOPJIT(this->func);
    pvVar2 = pvStack_40;
    if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
      pSVar8 = Func::GetScriptContext(this->func);
      BVar5 = Js::JavascriptOperators::LessEqual(src1Var,pvVar2,pSVar8);
      *result = BVar5 != 0;
      return true;
    }
    return false;
  }
  if (OVar1 == BrSrEq_A) {
LAB_0059e35b:
    if ((src1Var == (Var)0x0) || (src2Var == (Var)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      pVVar9 = ::Value::GetValueInfo(src2Val);
      bVar3 = ValueType::IsUndefined(&pVVar7->super_ValueType);
      if ((((((bVar3) &&
             ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenUndefined(&pVVar9->super_ValueType), !bVar3)))) ||
            ((bVar3 = ValueType::IsNull(&pVVar7->super_ValueType), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenNull(&pVVar9->super_ValueType), !bVar3)))))) ||
           (((bVar3 = ValueType::IsBoolean(&pVVar7->super_ValueType), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenBoolean(&pVVar9->super_ValueType), !bVar3)))) ||
            (((bVar3 = ValueType::IsNumber(&pVVar7->super_ValueType), bVar3 &&
              ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
               (bVar3 = ValueType::HasBeenNumber(&pVVar9->super_ValueType), !bVar3)))) ||
             ((((bVar3 = ValueType::IsString(&pVVar7->super_ValueType), bVar3 &&
                ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
                 (bVar3 = ValueType::HasBeenString(&pVVar9->super_ValueType), !bVar3)))) ||
               ((bVar3 = ValueType::IsUndefined(&pVVar9->super_ValueType), bVar3 &&
                ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
                 (bVar3 = ValueType::HasBeenUndefined(&pVVar7->super_ValueType), !bVar3)))))) ||
              ((bVar3 = ValueType::IsNull(&pVVar9->super_ValueType), bVar3 &&
               ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
                (bVar3 = ValueType::HasBeenNull(&pVVar7->super_ValueType), !bVar3)))))))))))) ||
          ((bVar3 = ValueType::IsBoolean(&pVVar9->super_ValueType), bVar3 &&
           ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
            (bVar3 = ValueType::HasBeenBoolean(&pVVar7->super_ValueType), !bVar3)))))) ||
         (((bVar3 = ValueType::IsNumber(&pVVar9->super_ValueType), bVar3 &&
           ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
            (bVar3 = ValueType::HasBeenNumber(&pVVar7->super_ValueType), !bVar3)))) ||
          ((bVar3 = ValueType::IsString(&pVVar9->super_ValueType), bVar3 &&
           ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
            (bVar3 = ValueType::HasBeenString(&pVVar7->super_ValueType), !bVar3)))))))) {
        *result = false;
      }
      else {
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,true);
        if (!bVar3) {
          return false;
        }
        *result = true;
      }
    }
    else {
      bVar3 = anon_unknown.dwarf_9e9497::Op_JitEq
                        (result,src1Val,src2Val,src1Var,src2Var,this->func,true);
      if (!bVar3) {
        return false;
      }
    }
  }
  else {
    if (OVar1 != BrSrNeq_A) {
      if (OVar1 == BrOnObject_A) {
        pVVar7 = ::Value::GetValueInfo(src1Val);
        bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType);
        if (!bVar3) {
          return false;
        }
        bVar3 = ValueType::IsPrimitive(&pVVar7->super_ValueType);
        if (!bVar3) {
          bVar3 = ValueType::HasBeenPrimitive(&pVVar7->super_ValueType);
          if (!bVar3) {
            *result = true;
            return true;
          }
          return false;
        }
        *result = false;
        return true;
      }
      if (OVar1 == BrNotEq_A) goto LAB_0059e244;
      if (OVar1 == BrNotNeq_A) goto LAB_0059e12d;
      if (OVar1 != BrSrNotEq_A) {
        if (OVar1 != BrSrNotNeq_A) {
          if (OVar1 == BrNotGe_A) {
            if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
              pVVar7 = ::Value::GetValueInfo(src1Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
              if (bVar3) {
                pVVar7 = ::Value::GetValueInfo(src2Val);
                bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
                if (bVar3) {
                  *result = constVal < (int)local_60;
                  return true;
                }
              }
            }
            if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
               (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,
                                   false), bVar3)) {
              *result = false;
              return true;
            }
            if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
              return false;
            }
            bVar3 = Func::IsOOPJIT(this->func);
            pvVar2 = pvStack_40;
            if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
              pSVar8 = Func::GetScriptContext(this->func);
              BVar5 = Js::JavascriptOperators::GreaterEqual(src1Var,pvVar2,pSVar8);
              *result = (bool)((BVar5 != 0 ^ 0xffU) & 1);
              return true;
            }
            return false;
          }
          if (OVar1 == BrNotGt_A) {
            if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
              pVVar7 = ::Value::GetValueInfo(src1Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
              if (bVar3) {
                pVVar7 = ::Value::GetValueInfo(src2Val);
                bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
                if (bVar3) {
                  *result = constVal <= (int)local_60;
                  return true;
                }
              }
            }
            if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
               (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,
                                   false), bVar3)) {
              *result = true;
              return true;
            }
            if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
              return false;
            }
            bVar3 = Func::IsOOPJIT(this->func);
            pvVar2 = pvStack_40;
            if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
              pSVar8 = Func::GetScriptContext(this->func);
              BVar5 = Js::JavascriptOperators::Greater(src1Var,pvVar2,pSVar8);
              *result = (bool)((BVar5 != 0 ^ 0xffU) & 1);
              return true;
            }
            return false;
          }
          if (OVar1 == BrNotLt_A) {
            if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
              pVVar7 = ::Value::GetValueInfo(src1Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
              if (bVar3) {
                pVVar7 = ::Value::GetValueInfo(src2Val);
                bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
                if (bVar3) {
                  *result = (int)local_60 <= constVal;
                  return true;
                }
              }
            }
            if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
               (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,
                                   false), bVar3)) {
              *result = true;
              return true;
            }
            if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
              return false;
            }
            bVar3 = Func::IsOOPJIT(this->func);
            pvVar2 = pvStack_40;
            if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
              pSVar8 = Func::GetScriptContext(this->func);
              BVar5 = Js::JavascriptOperators::Less(src1Var,pvVar2,pSVar8);
              *result = (bool)((BVar5 != 0 ^ 0xffU) & 1);
              return true;
            }
            return false;
          }
          if (OVar1 == BrNotLe_A) {
            if ((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) {
              pVVar7 = ::Value::GetValueInfo(src1Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
              if (bVar3) {
                pVVar7 = ::Value::GetValueInfo(src2Val);
                bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
                if (bVar3) {
                  *result = (int)local_60 < constVal;
                  return true;
                }
              }
            }
            if (((src1Val != (Value *)0x0) && (src2Val != (Value *)0x0)) &&
               (bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,
                                   false), bVar3)) {
              *result = false;
              return true;
            }
            if ((src1Var == (Var)0x0) || (pvStack_40 == (Var)0x0)) {
              return false;
            }
            bVar3 = Func::IsOOPJIT(this->func);
            pvVar2 = pvStack_40;
            if ((!bVar3) && ((DAT_01eafdde & 1) != 0)) {
              pSVar8 = Func::GetScriptContext(this->func);
              BVar5 = Js::JavascriptOperators::LessEqual(src1Var,pvVar2,pSVar8);
              *result = (bool)((BVar5 != 0 ^ 0xffU) & 1);
              return true;
            }
            return false;
          }
          if (OVar1 == BrEq_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
              if (bVar3) {
                *result = constVal == local_60;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
              if (bVar3) {
                *result = right64 == _right;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,true);
            if (bVar3) {
              *result = true;
              return true;
            }
            return false;
          }
          if (OVar1 == BrFalse_I4) {
            src1ValInfo._4_4_ = 0;
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue
                              (pVVar7,(int32 *)((long)&src1ValInfo + 4),false);
            if (bVar3) {
              *result = src1ValInfo._4_4_ == 0;
              return true;
            }
            return false;
          }
          if (OVar1 == BrGe_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
              if (bVar3) {
                *result = (int)local_60 <= constVal;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
              if (bVar3) {
                *result = (long)_right <= right64;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = true;
              return true;
            }
            return false;
          }
          if (OVar1 == BrUnGe_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,true);
              if (bVar3) {
                *result = local_60 <= (uint)constVal;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,true);
              if (bVar3) {
                *result = _right <= (ulong)right64;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = true;
              return true;
            }
            return false;
          }
          if (OVar1 == BrGt_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
              if (bVar3) {
                *result = (int)local_60 < constVal;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
              if (bVar3) {
                *result = (long)_right < right64;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = false;
              return true;
            }
            return false;
          }
          if (OVar1 == BrUnGt_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,true);
              if (bVar3) {
                *result = local_60 < (uint)constVal;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,true);
              if (bVar3) {
                *result = _right < (ulong)right64;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = false;
              return true;
            }
            return false;
          }
          if (OVar1 == BrLt_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
              if (bVar3) {
                *result = constVal < (int)local_60;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
              if (bVar3) {
                *result = right64 < (long)_right;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = false;
              return true;
            }
            return false;
          }
          if (OVar1 == BrUnLt_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,true);
              if (bVar3) {
                *result = (uint)constVal < local_60;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,true);
              if (bVar3) {
                *result = (ulong)right64 < _right;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = false;
              return true;
            }
            return false;
          }
          if (OVar1 == BrLe_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
              if (bVar3) {
                *result = constVal <= (int)local_60;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
              if (bVar3) {
                *result = right64 <= (long)_right;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = true;
              return true;
            }
            return false;
          }
          if (OVar1 == BrUnLe_I4) {
            if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
              return false;
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,true);
              if (bVar3) {
                *result = (uint)constVal <= local_60;
              }
            }
            pVVar7 = ::Value::GetValueInfo(src1Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,true);
            if (bVar3) {
              pVVar7 = ::Value::GetValueInfo(src2Val);
              bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,true);
              if (bVar3) {
                *result = (ulong)right64 <= _right;
                return true;
              }
            }
            bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false)
            ;
            if (bVar3) {
              *result = true;
              return true;
            }
            return false;
          }
          if (OVar1 != BrNeq_I4) {
            return false;
          }
          if ((src1Val == (Value *)0x0) || (src2Val == (Value *)0x0)) {
            return false;
          }
          pVVar7 = ::Value::GetValueInfo(src1Val);
          bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,&constVal,false);
          if (bVar3) {
            pVVar7 = ::Value::GetValueInfo(src2Val);
            bVar3 = ValueInfo::TryGetIntConstantValue(pVVar7,(int32 *)&local_60,false);
            if (bVar3) {
              *result = constVal != local_60;
            }
          }
          pVVar7 = ::Value::GetValueInfo(src1Val);
          bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,&right64,false);
          if (bVar3) {
            pVVar7 = ::Value::GetValueInfo(src2Val);
            bVar3 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&right,false);
            if (bVar3) {
              *result = right64 != _right;
              return true;
            }
          }
          bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,false);
          if (bVar3) {
            *result = false;
            return true;
          }
          return false;
        }
        goto LAB_0059e35b;
      }
    }
    if ((src1Var == (Var)0x0) || (src2Var == (Var)0x0)) {
      pVVar7 = ::Value::GetValueInfo(src1Val);
      pVVar9 = ::Value::GetValueInfo(src2Val);
      bVar3 = ValueType::IsUndefined(&pVVar7->super_ValueType);
      if (((((((bVar3) &&
              ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
               (bVar3 = ValueType::HasBeenUndefined(&pVVar9->super_ValueType), !bVar3)))) ||
             ((bVar3 = ValueType::IsNull(&pVVar7->super_ValueType), bVar3 &&
              ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
               (bVar3 = ValueType::HasBeenNull(&pVVar9->super_ValueType), !bVar3)))))) ||
            ((bVar3 = ValueType::IsBoolean(&pVVar7->super_ValueType), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenBoolean(&pVVar9->super_ValueType), !bVar3)))))) ||
           ((bVar3 = ValueType::IsNumber(&pVVar7->super_ValueType), bVar3 &&
            ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
             (bVar3 = ValueType::HasBeenNumber(&pVVar9->super_ValueType), !bVar3)))))) ||
          ((((bVar3 = ValueType::IsString(&pVVar7->super_ValueType), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(&pVVar9->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenString(&pVVar9->super_ValueType), !bVar3)))) ||
            ((bVar3 = ValueType::IsUndefined(&pVVar9->super_ValueType), bVar3 &&
             ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
              (bVar3 = ValueType::HasBeenUndefined(&pVVar7->super_ValueType), !bVar3)))))) ||
           ((bVar3 = ValueType::IsNull(&pVVar9->super_ValueType), bVar3 &&
            ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
             (bVar3 = ValueType::HasBeenNull(&pVVar7->super_ValueType), !bVar3)))))))) ||
         (((bVar3 = ValueType::IsBoolean(&pVVar9->super_ValueType), bVar3 &&
           ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
            (bVar3 = ValueType::HasBeenBoolean(&pVVar7->super_ValueType), !bVar3)))) ||
          (((bVar3 = ValueType::IsNumber(&pVVar9->super_ValueType), bVar3 &&
            ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
             (bVar3 = ValueType::HasBeenNumber(&pVVar7->super_ValueType), !bVar3)))) ||
           ((bVar3 = ValueType::IsString(&pVVar9->super_ValueType), bVar3 &&
            ((bVar3 = ValueType::IsDefinite(&pVVar7->super_ValueType), bVar3 &&
             (bVar3 = ValueType::HasBeenString(&pVVar7->super_ValueType), !bVar3)))))))))) {
        *result = true;
      }
      else {
        bVar3 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left64 + 7),src1Val,src2Val,true);
        if (!bVar3) {
          return false;
        }
        *result = false;
      }
    }
    else {
      bVar3 = anon_unknown.dwarf_9e9497::Op_JitNeq
                        (result,src1Val,src2Val,src1Var,src2Var,this->func,true);
      if (!bVar3) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool
GlobOpt::CanProveConditionalBranch(IR::Instr *instr, Value *src1Val, Value *src2Val, Js::Var src1Var, Js::Var src2Var, bool *result)
{
    auto AreSourcesEqual = [&](Value * val1, Value * val2, bool undefinedCmp) -> bool
    {
        // NaN !== NaN, and objects can have valueOf/toString
        if (val1->IsEqualTo(val2))
        {
            if (val1->GetValueInfo()->IsUndefined())
            {
                return undefinedCmp;
            }
            ValueInfo * valInfo = val1->GetValueInfo();
            return !valInfo->HasBeenUndefined() && valInfo->IsPrimitive() && valInfo->IsNotFloat();
        }
        return false;
    };

    // Make sure GetConstantVar only returns primitives.
    // TODO: OOP JIT, enabled these asserts
    //Assert(!src1Var || !Js::JavascriptOperators::IsObject(src1Var));
    //Assert(!src2Var || !Js::JavascriptOperators::IsObject(src2Var));

    int64 left64, right64;
    int32 left, right;
    int32 constVal;

    switch (instr->m_opcode)
    {
#define BRANCHSIGNED(OPCODE,CMP,TYPE,UNSIGNEDNESS,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val) \
        { \
            if (src1Val->GetValueInfo()->TryGetIntConstantValue(&left, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetIntConstantValue(&right, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left CMP(TYPE)right; \
            } \
            if (src1Val->GetValueInfo()->TryGetInt64ConstantValue(&left64, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetInt64ConstantValue(&right64, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left64 CMP(TYPE)right64; \
            } \
            else if (AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
            { \
                *result = 0 CMP 0; \
            } \
            else \
            { \
                return false; \
            } \
        } \
        else \
        { \
            return false; \
        } \
        break;

        BRANCHSIGNED(BrEq_I4, == , int64, false, true)
        BRANCHSIGNED(BrGe_I4, >= , int64, false, false)
        BRANCHSIGNED(BrGt_I4, > , int64, false, false)
        BRANCHSIGNED(BrLt_I4, < , int64, false, false)
        BRANCHSIGNED(BrLe_I4, <= , int64, false, false)
        BRANCHSIGNED(BrNeq_I4, != , int64, false, false)
        BRANCHSIGNED(BrUnGe_I4, >= , uint64, true, false)
        BRANCHSIGNED(BrUnGt_I4, > , uint64, true, false)
        BRANCHSIGNED(BrUnLt_I4, < , uint64, true, false)
        BRANCHSIGNED(BrUnLe_I4, <= , uint64, true, false)
#undef BRANCHSIGNED
#define BRANCH(OPCODE,CMP,VARCMPFUNC,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) && \
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right)) \
        { \
            *result = left CMP right; \
        } \
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
        { \
            *result = 0 CMP 0; \
        } \
        else if (src1Var && src2Var) \
        { \
            if (func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts)) \
            { \
                return false; \
            } \
            *result = VARCMPFUNC(src1Var, src2Var, this->func->GetScriptContext()); \
        } \
        else \
        { \
            return false; \
        } \
        break;

    BRANCH(BrGe_A, >= , Js::JavascriptOperators::GreaterEqual, /*undefinedEquality*/ false)
    BRANCH(BrNotGe_A, <, !Js::JavascriptOperators::GreaterEqual, false)
    BRANCH(BrLt_A, <, Js::JavascriptOperators::Less, false)
    BRANCH(BrNotLt_A, >= , !Js::JavascriptOperators::Less, false)
    BRANCH(BrGt_A, >, Js::JavascriptOperators::Greater, false)
    BRANCH(BrNotGt_A, <= , !Js::JavascriptOperators::Greater, false)
    BRANCH(BrLe_A, <= , Js::JavascriptOperators::LessEqual, false)
    BRANCH(BrNotLe_A, >, !Js::JavascriptOperators::LessEqual, false)
#undef BRANCH
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left == right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = true;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left != right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = false;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = false;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = true;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (src1ValueInfo->IsNull() || src1ValueInfo->IsUndefined())
        {
            *result = instr->m_opcode == Js::OpCode::BrFalse_A;
            break;
        }
        if (src1ValueInfo->IsObject() && src1ValueInfo->GetObjectType() > ObjectType::Object)
        {
            // Specific object types that are tracked are equivalent to 'true'
            *result = instr->m_opcode == Js::OpCode::BrTrue_A;
            break;
        }

        if (!src1Var)
        {
            return false;
        }

        // Set *result = (evaluates true) and negate it later for BrFalse
        if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetTrueAddr()))
        {
            *result = true;
        }
        else if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetFalseAddr()))
        {
            *result = false;
        }
        else if (Js::TaggedInt::Is(src1Var))
        {
            *result = (src1Var != reinterpret_cast<Js::Var>(Js::AtomTag_IntPtr));
        }
#if FLOATVAR
        else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
        {
            double value = Js::JavascriptNumber::GetValue(src1Var);
            *result = (!Js::JavascriptNumber::IsNan(value)) && (!Js::JavascriptNumber::IsZero(value));
        }
#endif
        else
        {
            return false;
        }

        if (instr->m_opcode == Js::OpCode::BrFalse_A)
        {
            *result = !(*result);
        }
        break;
    }
    case Js::OpCode::BrFalse_I4:
    {
        constVal = 0;
        if (!src1Val->GetValueInfo()->TryGetIntConstantValue(&constVal))
        {
            return false;
        }

        *result = constVal == 0;
        break;
    }
    case Js::OpCode::BrOnObject_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (!src1ValueInfo->IsDefinite())
        {
            return false;
        }

        if (src1ValueInfo->IsPrimitive())
        {
            *result = false;
        }
        else
        {
            if (src1ValueInfo->HasBeenPrimitive())
            {
                return false;
            }
            *result = true;
        }

        break;
    }
    default:
        return false;
    }
    return true;
}